

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ryml_all.hpp
# Opt level: O1

substr __thiscall
c4::yml::Parser::_scan_plain_scalar_blck
          (Parser *this,csubstr currscalar,csubstr peeked_line,size_t indentation)

{
  code *pcVar1;
  Location LVar2;
  Location LVar3;
  Location LVar4;
  Location LVar5;
  ulong uVar6;
  bool bVar7;
  size_t sVar8;
  char *pcVar9;
  size_t sVar10;
  ulong uVar11;
  char *pcVar12;
  char *pcVar13;
  long lVar14;
  char *pcVar15;
  bool bVar16;
  ro_substr chars;
  ro_substr chars_00;
  ro_substr chars_01;
  substr sVar17;
  basic_substring<const_char> bVar18;
  csubstr cVar19;
  basic_substring<char> bVar20;
  char msg [43];
  csubstr local_168;
  char *local_150;
  Parser *local_148;
  char *local_140;
  basic_substring<const_char> local_138;
  char acStack_128 [48];
  ulong local_f8;
  char *local_f0;
  size_t local_e8;
  undefined8 local_e0;
  undefined8 uStack_d8;
  undefined8 local_d0;
  char *pcStack_c8;
  undefined8 local_c0;
  undefined8 local_b8;
  undefined8 uStack_b0;
  undefined8 local_a8;
  char *pcStack_a0;
  undefined8 local_98;
  undefined8 local_90;
  undefined8 uStack_88;
  undefined8 local_80;
  char *pcStack_78;
  undefined8 local_70;
  undefined8 local_68;
  undefined8 uStack_60;
  undefined8 local_58;
  char *pcStack_50;
  undefined8 local_48;
  basic_substring<char> local_40;
  
  sVar10 = currscalar.len;
  pcVar13 = currscalar.str;
  sVar8 = (this->m_buf).len;
  local_168 = peeked_line;
  if (sVar8 == 0) {
    if (sVar10 == 0) {
      pcVar12 = (this->m_buf).str;
      pcVar9 = (char *)CONCAT71(peeked_line.str._1_7_,pcVar12 == pcVar13);
      bVar7 = pcVar12 != (char *)0x0 && pcVar12 == pcVar13;
      goto LAB_001e1470;
    }
LAB_001e1478:
    builtin_strncpy(acStack_128 + 0x10,"rrscalar))",0xb);
    builtin_strncpy(acStack_128,"_buf.is_super(cu",0x10);
    local_138.len._0_1_ = 'i';
    local_138.len._1_1_ = 'l';
    local_138.len._2_1_ = 'e';
    local_138.len._3_1_ = 'd';
    local_138.len._4_1_ = ':';
    local_138.len._5_1_ = ' ';
    local_138.len._6_1_ = '(';
    local_138.len._7_1_ = 'm';
    local_138.str = (char *)0x6166206b63656863;
    if (((s_error_flags & 1) != 0) && (bVar7 = is_debugger_attached(), bVar7)) {
      pcVar1 = (code *)swi(3);
      sVar17 = (substr)(*pcVar1)();
      return sVar17;
    }
    local_68 = 0;
    uStack_60 = 0x7586;
    local_58 = 0;
    pcStack_50 = 
    "/workspace/llm4binary/github/license_c_cmakelists/google[P]jsonnet/third_party/rapidyaml/ryml_all.hpp"
    ;
    local_48 = 0x65;
    pcVar9 = (char *)0x65;
    LVar2.super_LineCol.col = 0;
    LVar2.super_LineCol.offset = SUB168(ZEXT816(0x7586) << 0x40,0);
    LVar2.super_LineCol.line = SUB168(ZEXT816(0x7586) << 0x40,8);
    LVar2.name.str =
         "/workspace/llm4binary/github/license_c_cmakelists/google[P]jsonnet/third_party/rapidyaml/ryml_all.hpp"
    ;
    LVar2.name.len = 0x65;
    (*(this->m_stack).m_callbacks.m_error)
              ((char *)&local_138,0x2b,LVar2,(this->m_stack).m_callbacks.m_user_data);
  }
  else {
    pcVar9 = (this->m_buf).str;
    bVar7 = pcVar13 + sVar10 <= pcVar9 + sVar8 && pcVar9 <= pcVar13;
LAB_001e1470:
    if (!bVar7) goto LAB_001e1478;
  }
  if (pcVar13 + sVar10 < (this->m_buf).str) {
    builtin_strncpy(acStack_128,"urrscalar.end() >= m_buf.begin())",0x22);
    local_138.len._0_1_ = 'i';
    local_138.len._1_1_ = 'l';
    local_138.len._2_1_ = 'e';
    local_138.len._3_1_ = 'd';
    local_138.len._4_1_ = ':';
    local_138.len._5_1_ = ' ';
    local_138.len._6_1_ = '(';
    local_138.len._7_1_ = 'c';
    local_138.str = (char *)0x6166206b63656863;
    if (((s_error_flags & 1) != 0) && (bVar7 = is_debugger_attached(), bVar7)) {
      pcVar1 = (code *)swi(3);
      sVar17 = (substr)(*pcVar1)();
      return sVar17;
    }
    local_90 = 0;
    uStack_88 = 0x7589;
    local_80 = 0;
    pcStack_78 = 
    "/workspace/llm4binary/github/license_c_cmakelists/google[P]jsonnet/third_party/rapidyaml/ryml_all.hpp"
    ;
    local_70 = 0x65;
    pcVar9 = (char *)0x65;
    LVar3.super_LineCol.col = 0;
    LVar3.super_LineCol.offset = SUB168(ZEXT816(0x7589) << 0x40,0);
    LVar3.super_LineCol.line = SUB168(ZEXT816(0x7589) << 0x40,8);
    LVar3.name.str =
         "/workspace/llm4binary/github/license_c_cmakelists/google[P]jsonnet/third_party/rapidyaml/ryml_all.hpp"
    ;
    LVar3.name.len = 0x65;
    (*(this->m_stack).m_callbacks.m_error)
              ((char *)&local_138,0x32,LVar3,(this->m_stack).m_callbacks.m_user_data);
  }
  pcVar12 = (this->m_buf).str;
  if (indentation <= local_168.len) {
    bVar7 = indentation == 0;
    if (!bVar7) {
      if (*local_168.str != ' ') goto LAB_001e163b;
      pcVar15 = (char *)0x1;
      do {
        pcVar9 = pcVar15;
        if ((char *)indentation == pcVar9) break;
        pcVar15 = pcVar9 + 1;
      } while (local_168.str[(long)pcVar9] == ' ');
      bVar7 = indentation <= pcVar9;
    }
    if (bVar7) goto LAB_001e16ff;
  }
LAB_001e163b:
  builtin_strncpy(acStack_128 + 0x20,"ntation))",10);
  builtin_strncpy(acStack_128 + 0x10,"s_with(\' \', inde",0x10);
  builtin_strncpy(acStack_128,"eeked_line.begin",0x10);
  local_138.len._0_1_ = 'i';
  local_138.len._1_1_ = 'l';
  local_138.len._2_1_ = 'e';
  local_138.len._3_1_ = 'd';
  local_138.len._4_1_ = ':';
  local_138.len._5_1_ = ' ';
  local_138.len._6_1_ = '(';
  local_138.len._7_1_ = 'p';
  local_138.str = (char *)0x6166206b63656863;
  if (((s_error_flags & 1) != 0) && (bVar7 = is_debugger_attached(), bVar7)) {
    pcVar1 = (code *)swi(3);
    sVar17 = (substr)(*pcVar1)();
    return sVar17;
  }
  local_b8 = 0;
  uStack_b0 = 0x758b;
  local_a8 = 0;
  pcStack_a0 = 
  "/workspace/llm4binary/github/license_c_cmakelists/google[P]jsonnet/third_party/rapidyaml/ryml_all.hpp"
  ;
  local_98 = 0x65;
  pcVar9 = (char *)0x65;
  LVar4.super_LineCol.col = 0;
  LVar4.super_LineCol.offset = SUB168(ZEXT816(0x758b) << 0x40,0);
  LVar4.super_LineCol.line = SUB168(ZEXT816(0x758b) << 0x40,8);
  LVar4.name.str =
       "/workspace/llm4binary/github/license_c_cmakelists/google[P]jsonnet/third_party/rapidyaml/ryml_all.hpp"
  ;
  LVar4.name.len = 0x65;
  (*(this->m_stack).m_callbacks.m_error)
            ((char *)&local_138,0x3a,LVar4,(this->m_stack).m_callbacks.m_user_data);
LAB_001e16ff:
  bVar7 = indentation == 0;
  local_148 = this;
  local_140 = (char *)indentation;
  local_f8 = (long)(pcVar13 + sVar10) - (long)pcVar12;
  local_f0 = pcVar13;
  local_e8 = sVar10;
  do {
    if ((char *)0x2 < local_168.len) {
      if (*local_168.str == '.') {
        uVar6 = 0;
        do {
          uVar11 = uVar6;
          if (uVar11 == 2) break;
          uVar6 = uVar11 + 1;
        } while (local_168.str[uVar11 + 1] == "\t..."[uVar11 + 2]);
        if (1 < uVar11) goto LAB_001e1afc;
      }
      pcVar9 = local_168.str;
      if (((char *)0x2 < local_168.len) && (*local_168.str == '-')) {
        uVar6 = 0;
        do {
          uVar11 = uVar6;
          if (uVar11 == 2) break;
          uVar6 = uVar11 + 1;
        } while (local_168.str[uVar11 + 1] == "---"[uVar11 + 1]);
        if (1 < uVar11) goto LAB_001e1afc;
      }
    }
    if (local_168.len < indentation) {
LAB_001e17ed:
      chars.len = 4;
      chars.str = " \r\n\t";
      local_138 = basic_substring<const_char>::triml(&local_168,chars);
      chars_00.len = 4;
      chars_00.str = " \r\n\t";
      bVar18 = basic_substring<const_char>::trimr(&local_138,chars_00);
      bVar16 = bVar18.len == 0;
      pcVar9 = (char *)CONCAT71((int7)((ulong)pcVar9 >> 8),bVar16);
      if (bVar18.str != (char *)0x0 && !bVar16) goto LAB_001e1afc;
      cVar19 = _scan_to_next_nonempty_line(this,indentation);
      if ((cVar19.len == 0) || (cVar19.str == (char *)0x0)) goto LAB_001e1afc;
    }
    else {
      bVar16 = bVar7;
      if ((char *)indentation != (char *)0x0) {
        if (*local_168.str != ' ') goto LAB_001e17ed;
        pcVar13 = (char *)0x1;
        do {
          pcVar9 = pcVar13;
          if ((char *)indentation == pcVar9) break;
          pcVar13 = pcVar9 + 1;
        } while (local_168.str[(long)pcVar9] == ' ');
        bVar16 = indentation <= pcVar9;
      }
      cVar19 = local_168;
      if (!bVar16) goto LAB_001e17ed;
    }
    local_168 = cVar19;
    if ((local_168.len < 2) || (pcVar13 = (char *)(local_168.len - 1), local_168.len == 1)) {
LAB_001e1978:
      if ((local_168.len != 0) && (local_168.str[local_168.len - 1] == ':')) {
        sVar8 = basic_substring<const_char>::first_of(&local_168,':',0);
        _line_progressed(this,sVar8);
        bVar16 = is_debugger_attached();
        indentation = (size_t)local_140;
        pcVar13 = "ERROR: lines cannot end with \':\' in plain flow (unquoted) scalars";
        if (bVar16) {
          bVar16 = is_debugger_attached();
          pcVar13 = "ERROR: lines cannot end with \':\' in plain flow (unquoted) scalars";
          if (bVar16) {
            pcVar1 = (code *)swi(3);
            sVar17 = (substr)(*pcVar1)();
            return sVar17;
          }
        }
        goto LAB_001e1ac5;
      }
      pcVar13 = (char *)0xffffffffffffffff;
      if ((1 < local_168.len) && (pcVar12 = (char *)(local_168.len - 1), local_168.len != 1)) {
        pcVar15 = (char *)0x0;
        do {
          bVar16 = true;
          lVar14 = 0;
          pcVar13 = pcVar9;
          do {
            if (local_168.len <= pcVar15 + lVar14) {
              local_150 = pcVar13;
              _scan_plain_scalar_blck();
              pcVar13 = local_150;
            }
            pcVar9 = pcVar13;
            if ((local_168.str + (long)pcVar15)[lVar14] != " #"[lVar14]) break;
            bVar16 = lVar14 == 0;
            lVar14 = lVar14 + 1;
            pcVar9 = pcVar15;
          } while (lVar14 != 2);
          pcVar13 = pcVar9;
          this = local_148;
        } while ((bVar16) &&
                (pcVar15 = pcVar15 + 1, pcVar13 = (char *)0xffffffffffffffff, pcVar15 != pcVar12));
      }
      indentation = (size_t)local_140;
      if (pcVar13 != (char *)0xffffffffffffffff) {
        _line_progressed(this,(size_t)pcVar13);
LAB_001e1afc:
        sVar8 = local_e8;
        pcVar13 = local_f0;
        uVar6 = local_f8;
        if ((this->m_state->pos).super_LineCol.offset < local_f8) {
          builtin_strncpy(acStack_128 + 0x10,"et >= offs)",0xc);
          builtin_strncpy(acStack_128,"_state->pos.offs",0x10);
          local_138.len._0_1_ = 'i';
          local_138.len._1_1_ = 'l';
          local_138.len._2_1_ = 'e';
          local_138.len._3_1_ = 'd';
          local_138.len._4_1_ = ':';
          local_138.len._5_1_ = ' ';
          local_138.len._6_1_ = '(';
          local_138.len._7_1_ = 'm';
          local_138.str = (char *)0x6166206b63656863;
          if (((s_error_flags & 1) != 0) && (bVar7 = is_debugger_attached(), bVar7)) {
            pcVar1 = (code *)swi(3);
            sVar17 = (substr)(*pcVar1)();
            return sVar17;
          }
          local_e0 = 0;
          uStack_d8 = 0x75c2;
          local_d0 = 0;
          pcStack_c8 = 
          "/workspace/llm4binary/github/license_c_cmakelists/google[P]jsonnet/third_party/rapidyaml/ryml_all.hpp"
          ;
          local_c0 = 0x65;
          LVar5.super_LineCol.col = 0;
          LVar5.super_LineCol.offset = SUB168(ZEXT816(0x75c2) << 0x40,0);
          LVar5.super_LineCol.line = SUB168(ZEXT816(0x75c2) << 0x40,8);
          LVar5.name.str =
               "/workspace/llm4binary/github/license_c_cmakelists/google[P]jsonnet/third_party/rapidyaml/ryml_all.hpp"
          ;
          LVar5.name.len = 0x65;
          (*(this->m_stack).m_callbacks.m_error)
                    ((char *)&local_138,0x2c,LVar5,(this->m_stack).m_callbacks.m_user_data);
        }
        basic_substring<char>::basic_substring
                  (&local_40,pcVar13,(sVar8 - uVar6) + (this->m_state->pos).super_LineCol.offset);
        chars_01.len = 3;
        chars_01.str = "\r\n ";
        bVar20 = basic_substring<char>::trimr(&local_40,chars_01);
        sVar17.str = bVar20.str;
        sVar17.len = bVar20.len;
        return sVar17;
      }
    }
    else {
      pcVar12 = (char *)0x0;
      do {
        bVar16 = true;
        lVar14 = 0;
        pcVar15 = pcVar9;
        do {
          if (local_168.len <= pcVar12 + lVar14) {
            local_150 = pcVar15;
            _scan_plain_scalar_blck();
            pcVar15 = local_150;
          }
          pcVar9 = pcVar15;
          if ((local_168.str + (long)pcVar12)[lVar14] != "\": "[lVar14 + 1]) break;
          bVar16 = lVar14 == 0;
          lVar14 = lVar14 + 1;
          pcVar9 = pcVar12;
        } while (lVar14 != 2);
        if (!bVar16) goto LAB_001e18dc;
        pcVar12 = pcVar12 + 1;
      } while (pcVar12 != pcVar13);
      pcVar9 = (char *)0xffffffffffffffff;
LAB_001e18dc:
      this = local_148;
      if (pcVar9 == (char *)0xffffffffffffffff) goto LAB_001e1978;
      pcVar13 = (char *)0xffffffffffffffff;
      if ((1 < local_168.len) && (pcVar12 = (char *)(local_168.len - 1), local_168.len != 1)) {
        pcVar15 = (char *)0x0;
        do {
          bVar16 = true;
          lVar14 = 0;
          pcVar13 = pcVar9;
          do {
            if (local_168.len <= pcVar15 + lVar14) {
              local_150 = pcVar13;
              _scan_plain_scalar_blck();
              pcVar13 = local_150;
            }
            pcVar9 = pcVar13;
            if ((local_168.str + (long)pcVar15)[lVar14] != "\": "[lVar14 + 1]) break;
            bVar16 = lVar14 == 0;
            lVar14 = lVar14 + 1;
            pcVar9 = pcVar15;
          } while (lVar14 != 2);
          pcVar13 = pcVar9;
        } while ((bVar16) &&
                (pcVar15 = pcVar15 + 1, pcVar13 = (char *)0xffffffffffffffff, pcVar15 != pcVar12));
      }
      this = local_148;
      _line_progressed(local_148,(size_t)pcVar13);
      bVar16 = is_debugger_attached();
      indentation = (size_t)local_140;
      pcVar13 = "ERROR: \': \' is not a valid token in plain flow (unquoted) scalars";
      if (bVar16) {
        bVar16 = is_debugger_attached();
        pcVar13 = "ERROR: \': \' is not a valid token in plain flow (unquoted) scalars";
        if (bVar16) {
          pcVar1 = (code *)swi(3);
          sVar17 = (substr)(*pcVar1)();
          return sVar17;
        }
      }
LAB_001e1ac5:
      cVar19.len = 0x41;
      cVar19.str = pcVar13;
      _err<>(this,cVar19);
    }
    bVar16 = _advance_to_peeked(this);
    if (!bVar16) goto LAB_001e1afc;
    local_168 = (this->m_state->line_contents).rem;
  } while( true );
}

Assistant:

substr Parser::_scan_plain_scalar_blck(csubstr currscalar, csubstr peeked_line, size_t indentation)
{
    _RYML_CB_ASSERT(m_stack.m_callbacks, m_buf.is_super(currscalar));
    // NOTE. there's a problem with _scan_to_next_nonempty_line(), as it counts newlines twice
    // size_t offs = m_state->pos.offset;   // so we workaround by directly counting from the end of the given scalar
    _RYML_CB_ASSERT(m_stack.m_callbacks, currscalar.end() >= m_buf.begin());
    size_t offs = static_cast<size_t>(currscalar.end() - m_buf.begin());
    _RYML_CB_ASSERT(m_stack.m_callbacks, peeked_line.begins_with(' ', indentation));
    while(true)
    {
        _c4dbgpf("rscalar[IMPL]: continuing... ref_indentation={}", indentation);
        if(peeked_line.begins_with("...") || peeked_line.begins_with("---"))
        {
            _c4dbgpf("rscalar[IMPL]: document termination next -- bail now '{}'", peeked_line.trimr("\r\n"));
            break;
        }
        else if(( ! peeked_line.begins_with(' ', indentation))) // is the line deindented?
        {
            if(!peeked_line.trim(" \r\n\t").empty()) // is the line not blank?
            {
                _c4dbgpf("rscalar[IMPL]: deindented line, not blank -- bail now '{}'", peeked_line.trimr("\r\n"));
                break;
            }
            _c4dbgpf("rscalar[IMPL]: line is blank and has less indentation: ref={} line={}: '{}'", indentation, peeked_line.first_not_of(' ') == csubstr::npos ? 0 : peeked_line.first_not_of(' '), peeked_line.trimr("\r\n"));
            _c4dbgpf("rscalar[IMPL]: ... searching for a line starting at indentation {}", indentation);
            csubstr next_peeked = _scan_to_next_nonempty_line(indentation);
            if(next_peeked.empty())
            {
                _c4dbgp("rscalar[IMPL]: ... finished.");
                break;
            }
            _c4dbgp("rscalar[IMPL]: ... continuing.");
            peeked_line = next_peeked;
        }

        _c4dbgpf("rscalar[IMPL]: line contents: '{}'", peeked_line.right_of(indentation, true).trimr("\r\n"));
        size_t token_pos;
        if(peeked_line.find(": ") != npos)
        {
            _line_progressed(peeked_line.find(": "));
            _c4err("': ' is not a valid token in plain flow (unquoted) scalars");
        }
        else if(peeked_line.ends_with(':'))
        {
            _line_progressed(peeked_line.find(':'));
            _c4err("lines cannot end with ':' in plain flow (unquoted) scalars");
        }
        else if((token_pos = peeked_line.find(" #")) != npos)
        {
            _line_progressed(token_pos);
            break;
            //_c4err("' #' is not a valid token in plain flow (unquoted) scalars");
        }

        _c4dbgpf("rscalar[IMPL]: append another line: (len={})'{}'", peeked_line.len, peeked_line.trimr("\r\n"));
        if(!_advance_to_peeked())
        {
            _c4dbgp("rscalar[IMPL]: file finishes after the scalar");
            break;
        }
        peeked_line = m_state->line_contents.rem;
    }
    _RYML_CB_ASSERT(m_stack.m_callbacks, m_state->pos.offset >= offs);
    substr full(m_buf.str + (currscalar.str - m_buf.str),
                currscalar.len + (m_state->pos.offset - offs));
    full = full.trimr("\r\n ");
    return full;
}